

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

void leveldb_writebatch_iterate
               (leveldb_writebatch_t *b,void *state,
               _func_void_void_ptr_char_ptr_size_t_char_ptr_size_t *put,
               _func_void_void_ptr_char_ptr_size_t *deleted)

{
  H handler;
  WriteBatch local_30;
  _func_void_void_ptr_char_ptr_size_t *local_10;
  
  local_30.rep_._M_string_length = (size_type)&PTR__Handler_001340c0;
  local_30.rep_.field_2._M_allocated_capacity = (size_type)state;
  local_30.rep_.field_2._8_8_ = put;
  local_10 = deleted;
  leveldb::WriteBatch::Iterate(&local_30,(Handler *)b);
  if (local_30.rep_._M_dataplus._M_p != (pointer)0x0) {
    operator_delete__(local_30.rep_._M_dataplus._M_p);
  }
  leveldb::WriteBatch::Handler::~Handler((Handler *)&local_30.rep_._M_string_length);
  return;
}

Assistant:

void leveldb_writebatch_iterate(const leveldb_writebatch_t* b, void* state,
                                void (*put)(void*, const char* k, size_t klen,
                                            const char* v, size_t vlen),
                                void (*deleted)(void*, const char* k,
                                                size_t klen)) {
  class H : public WriteBatch::Handler {
   public:
    void* state_;
    void (*put_)(void*, const char* k, size_t klen, const char* v, size_t vlen);
    void (*deleted_)(void*, const char* k, size_t klen);
    void Put(const Slice& key, const Slice& value) override {
      (*put_)(state_, key.data(), key.size(), value.data(), value.size());
    }
    void Delete(const Slice& key) override {
      (*deleted_)(state_, key.data(), key.size());
    }
  };
  H handler;
  handler.state_ = state;
  handler.put_ = put;
  handler.deleted_ = deleted;
  b->rep.Iterate(&handler);
}